

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O3

void add_contains_test(void)

{
  ushort uVar1;
  array_container_t *container;
  uint16_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  unsigned_long uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  size_t x;
  ushort uVar13;
  size_t x_1;
  unsigned_long uVar14;
  long lVar15;
  bool bVar16;
  
  container = array_container_create();
  _assert_true((unsigned_long)container,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x27);
  uVar14 = 0;
  uVar13 = 0;
LAB_00104233:
  iVar5 = container->cardinality;
  if (((long)iVar5 == 0) ||
     ((puVar2 = container->array, iVar5 != 0x7fffffff && (puVar2[(long)iVar5 + -1] < uVar13)))) {
    if (iVar5 == container->capacity) {
      array_container_grow(container,iVar5 + 1,true);
      iVar5 = container->cardinality;
    }
    container->cardinality = iVar5 + 1;
    container->array[iVar5] = uVar13;
    uVar8 = 1;
  }
  else {
    if (iVar5 < 1) {
      uVar10 = 0;
    }
    else {
      iVar12 = iVar5 + -1;
      uVar10 = 0;
      do {
        uVar7 = iVar12 + uVar10 >> 1;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar12 + uVar10 & 0xfffffffe));
        if (uVar1 < uVar13) {
          uVar10 = uVar7 + 1;
        }
        else {
          if (uVar1 <= uVar13) goto LAB_001042bb;
          iVar12 = uVar7 - 1;
        }
      } while ((int)uVar10 <= iVar12);
      if (iVar5 == 0x7fffffff) {
LAB_001042bb:
        uVar8 = 0;
        goto LAB_00104317;
      }
    }
    if (iVar5 == container->capacity) {
      array_container_grow(container,iVar5 + 1,true);
      puVar2 = container->array;
    }
    memmove(puVar2 + (ulong)uVar10 + 1,puVar2 + uVar10,(long)(int)(iVar5 - uVar10) * 2);
    container->array[uVar10] = uVar13;
    container->cardinality = container->cardinality + 1;
    uVar8 = 1;
  }
LAB_00104317:
  _assert_true(uVar8,"array_container_add(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x2c);
  uVar10 = 0;
  uVar7 = container->cardinality;
  do {
    iVar5 = uVar10 + 0x10;
    while( true ) {
      if ((int)uVar7 <= iVar5) {
        if ((int)uVar7 <= (int)uVar10) goto LAB_00104388;
        uVar3 = (ulong)uVar10;
        goto LAB_0010436a;
      }
      uVar9 = (uVar7 - 1) + uVar10;
      uVar6 = uVar9 >> 1;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar9 & 0xfffffffe));
      if (uVar13 <= uVar1) break;
      uVar10 = uVar6 + 1;
      iVar5 = uVar6 + 0x11;
    }
    uVar7 = uVar6;
  } while (uVar13 < uVar1);
LAB_0010435d:
  uVar8 = 1;
  goto LAB_0010438a;
  while( true ) {
    if (uVar13 <= uVar1 && uVar1 != uVar13) goto LAB_00104388;
    uVar8 = 0;
    iVar5 = (int)uVar3;
    uVar3 = uVar3 + 1;
    if (uVar7 - 1 == iVar5) break;
LAB_0010436a:
    uVar1 = container->array[uVar3];
    if (uVar1 == uVar13) goto LAB_0010435d;
  }
LAB_0010438a:
  _assert_true(uVar8,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x2d);
  uVar14 = uVar14 + 1;
  _assert_int_equal((long)container->cardinality,uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x2e);
  _assert_true((ulong)(container->cardinality <= container->capacity),"B->cardinality > B->capacity"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x2f);
  uVar13 = uVar13 + 3;
  if (uVar14 == 0x5556) goto code_r0x001043e4;
  goto LAB_00104233;
LAB_00104388:
  uVar8 = 0;
  goto LAB_0010438a;
code_r0x001043e4:
  lVar15 = 0;
LAB_00104402:
  uVar3 = 0;
  uVar10 = container->cardinality;
  do {
    iVar5 = (int)uVar3 + 0x10;
    uVar13 = (ushort)lVar15;
    while( true ) {
      if ((int)uVar10 <= iVar5) {
        if ((int)uVar10 <= (int)uVar3) goto LAB_00104463;
        goto LAB_00104445;
      }
      uVar6 = (uVar10 - 1) + (int)uVar3;
      uVar7 = uVar6 >> 1;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar6 & 0xfffffffe));
      if (uVar13 <= uVar1) break;
      uVar3 = (ulong)(uVar7 + 1);
      iVar5 = uVar7 + 0x11;
    }
    uVar10 = uVar7;
  } while (uVar13 < uVar1);
LAB_00104438:
  uVar14 = 1;
  goto LAB_00104465;
  while( true ) {
    if (uVar13 < uVar1) goto LAB_00104463;
    uVar14 = 0;
    iVar5 = (int)uVar3;
    uVar3 = uVar3 + 1;
    if (uVar10 - 1 == iVar5) break;
LAB_00104445:
    uVar1 = container->array[uVar3];
    if (uVar1 == uVar13) goto LAB_00104438;
  }
LAB_00104465:
  _assert_int_equal(uVar14,(ulong)((ulong)(lVar15 * -0x5555555555555555) < 0x5555555555555556),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x33);
  lVar15 = lVar15 + 1;
  if (lVar15 == 0x10000) goto code_r0x00104492;
  goto LAB_00104402;
LAB_00104463:
  uVar14 = 0;
  goto LAB_00104465;
code_r0x00104492:
  uVar14 = 0x5556;
  _assert_int_equal((long)container->cardinality,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x36);
  uVar3 = 0;
LAB_001044c4:
  uVar10 = 0;
  uVar7 = container->cardinality;
  do {
    iVar5 = uVar10 + 0x10;
    uVar13 = (ushort)uVar3;
    while( true ) {
      if ((int)uVar7 <= iVar5) {
        if ((int)uVar7 <= (int)uVar10) goto LAB_00104524;
        uVar4 = (ulong)uVar10;
        goto LAB_00104507;
      }
      uVar9 = (uVar7 - 1) + uVar10;
      uVar6 = uVar9 >> 1;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar9 & 0xfffffffe));
      if (uVar13 <= uVar1) break;
      uVar10 = uVar6 + 1;
      iVar5 = uVar6 + 0x11;
    }
    uVar7 = uVar6;
  } while (uVar13 < uVar1);
LAB_001044fa:
  uVar8 = 1;
  goto LAB_00104526;
  while( true ) {
    if (uVar13 <= uVar1 && uVar1 != uVar13) goto LAB_00104524;
    uVar8 = 0;
    iVar5 = (int)uVar4;
    uVar4 = uVar4 + 1;
    if (uVar7 - 1 == iVar5) break;
LAB_00104507:
    uVar1 = container->array[uVar4];
    if (uVar1 == uVar13) goto LAB_001044fa;
  }
LAB_00104526:
  _assert_true(uVar8,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x39);
  iVar5 = container->cardinality;
  if (0 < iVar5) {
    puVar2 = container->array;
    iVar12 = iVar5 + -1;
    iVar11 = 0;
    do {
      uVar10 = (uint)(iVar12 + iVar11) >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar12 + iVar11 & 0xfffffffe));
      if (uVar1 < uVar13) {
        iVar11 = uVar10 + 1;
      }
      else {
        if (uVar1 <= uVar13) {
          memmove(puVar2 + uVar10,puVar2 + (ulong)uVar10 + 1,(long)(int)(iVar5 + ~uVar10) * 2);
          container->cardinality = container->cardinality + -1;
          uVar8 = 1;
          goto LAB_00104593;
        }
        iVar12 = uVar10 - 1;
      }
    } while (iVar11 <= iVar12);
  }
  uVar8 = 0;
LAB_00104593:
  _assert_true(uVar8,"array_container_remove(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x3a);
  uVar14 = uVar14 - 1;
  _assert_int_equal((long)container->cardinality,uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x3b);
  uVar10 = 0;
  uVar7 = container->cardinality;
  do {
    iVar5 = uVar10 + 0x10;
    while( true ) {
      if ((int)uVar7 <= iVar5) {
        uVar8 = 1;
        if ((int)uVar7 <= (int)uVar10) goto LAB_00104614;
        uVar4 = (ulong)uVar10;
        goto LAB_001045fe;
      }
      uVar9 = (uVar7 - 1) + uVar10;
      uVar6 = uVar9 >> 1;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar9 & 0xfffffffe));
      if (uVar13 <= uVar1) break;
      uVar10 = uVar6 + 1;
      iVar5 = uVar6 + 0x11;
    }
    uVar7 = uVar6;
  } while (uVar13 < uVar1);
LAB_001045ef:
  uVar8 = 0;
LAB_00104614:
  _assert_true(uVar8,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x3c);
  bVar16 = 0xfffc < uVar3;
  uVar3 = uVar3 + 3;
  if (bVar16) goto code_r0x00104638;
  goto LAB_001044c4;
LAB_00104524:
  uVar8 = 0;
  goto LAB_00104526;
  while ((uVar1 <= uVar13 && (iVar5 = (int)uVar4, uVar4 = uVar4 + 1, uVar7 - 1 != iVar5))) {
LAB_001045fe:
    uVar1 = container->array[uVar4];
    if (uVar1 == uVar13) goto LAB_001045ef;
  }
  goto LAB_00104614;
code_r0x00104638:
  uVar14 = 0;
  _assert_int_equal((long)container->cardinality,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x3f);
  uVar13 = 0xffff;
LAB_00104661:
  iVar5 = container->cardinality;
  if (((long)iVar5 == 0) ||
     ((puVar2 = container->array, iVar5 != 0x7fffffff && (puVar2[(long)iVar5 + -1] < uVar13)))) {
    if (iVar5 == container->capacity) {
      array_container_grow(container,iVar5 + 1,true);
      iVar5 = container->cardinality;
    }
    container->cardinality = iVar5 + 1;
    container->array[iVar5] = uVar13;
    uVar8 = 1;
  }
  else {
    if (iVar5 < 1) {
      uVar10 = 0;
    }
    else {
      iVar12 = iVar5 + -1;
      uVar10 = 0;
      do {
        uVar7 = iVar12 + uVar10 >> 1;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar12 + uVar10 & 0xfffffffe));
        if (uVar1 < uVar13) {
          uVar10 = uVar7 + 1;
        }
        else {
          if (uVar1 <= uVar13) goto LAB_001046e9;
          iVar12 = uVar7 - 1;
        }
      } while ((int)uVar10 <= iVar12);
      if (iVar5 == 0x7fffffff) {
LAB_001046e9:
        uVar8 = 0;
        goto LAB_00104745;
      }
    }
    if (iVar5 == container->capacity) {
      array_container_grow(container,iVar5 + 1,true);
      puVar2 = container->array;
    }
    memmove(puVar2 + (ulong)uVar10 + 1,puVar2 + uVar10,(long)(int)(iVar5 - uVar10) * 2);
    container->array[uVar10] = uVar13;
    container->cardinality = container->cardinality + 1;
    uVar8 = 1;
  }
LAB_00104745:
  _assert_true(uVar8,"array_container_add(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x42);
  uVar10 = 0;
  uVar7 = container->cardinality;
  do {
    iVar5 = uVar10 + 0x10;
    while( true ) {
      if ((int)uVar7 <= iVar5) {
        if ((int)uVar7 <= (int)uVar10) goto LAB_001047b6;
        uVar3 = (ulong)uVar10;
        goto LAB_00104798;
      }
      uVar9 = (uVar7 - 1) + uVar10;
      uVar6 = uVar9 >> 1;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar9 & 0xfffffffe));
      if (uVar13 <= uVar1) break;
      uVar10 = uVar6 + 1;
      iVar5 = uVar6 + 0x11;
    }
    uVar7 = uVar6;
  } while (uVar13 < uVar1);
LAB_0010478b:
  uVar8 = 1;
  goto LAB_001047b8;
  while( true ) {
    if (uVar13 <= uVar1 && uVar1 != uVar13) goto LAB_001047b6;
    uVar8 = 0;
    iVar5 = (int)uVar3;
    uVar3 = uVar3 + 1;
    if (uVar7 - 1 == iVar5) break;
LAB_00104798:
    uVar1 = container->array[uVar3];
    if (uVar1 == uVar13) goto LAB_0010478b;
  }
LAB_001047b8:
  _assert_true(uVar8,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x43);
  uVar14 = uVar14 + 1;
  _assert_int_equal((long)container->cardinality,uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x44);
  _assert_true((ulong)(container->cardinality <= container->capacity),"B->cardinality > B->capacity"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x45);
  uVar13 = uVar13 - 3;
  if (uVar14 == 0x5556) goto code_r0x00104812;
  goto LAB_00104661;
LAB_001047b6:
  uVar8 = 0;
  goto LAB_001047b8;
code_r0x00104812:
  _assert_int_equal((long)container->cardinality,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x48);
  lVar15 = 0;
LAB_00104845:
  uVar3 = 0;
  uVar10 = container->cardinality;
  do {
    iVar5 = (int)uVar3 + 0x10;
    uVar13 = (ushort)lVar15;
    while( true ) {
      if ((int)uVar10 <= iVar5) {
        if ((int)uVar10 <= (int)uVar3) goto LAB_001048a6;
        goto LAB_00104888;
      }
      uVar6 = (uVar10 - 1) + (int)uVar3;
      uVar7 = uVar6 >> 1;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar6 & 0xfffffffe));
      if (uVar13 <= uVar1) break;
      uVar3 = (ulong)(uVar7 + 1);
      iVar5 = uVar7 + 0x11;
    }
    uVar10 = uVar7;
  } while (uVar13 < uVar1);
LAB_0010487b:
  uVar14 = 1;
  goto LAB_001048a8;
  while( true ) {
    if (uVar13 < uVar1) goto LAB_001048a6;
    uVar14 = 0;
    iVar5 = (int)uVar3;
    uVar3 = uVar3 + 1;
    if (uVar10 - 1 == iVar5) break;
LAB_00104888:
    uVar1 = container->array[uVar3];
    if (uVar1 == uVar13) goto LAB_0010487b;
  }
LAB_001048a8:
  _assert_int_equal(uVar14,(ulong)((ulong)(lVar15 * -0x5555555555555555) < 0x5555555555555556),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x4b);
  lVar15 = lVar15 + 1;
  if (lVar15 == 0x10000) goto code_r0x001048d5;
  goto LAB_00104845;
LAB_001048a6:
  uVar14 = 0;
  goto LAB_001048a8;
code_r0x001048d5:
  uVar14 = 0x5556;
  uVar3 = 0;
LAB_001048f2:
  uVar10 = 0;
  uVar7 = container->cardinality;
  do {
    iVar5 = uVar10 + 0x10;
    uVar13 = (ushort)uVar3;
    while( true ) {
      if ((int)uVar7 <= iVar5) {
        if ((int)uVar7 <= (int)uVar10) goto LAB_00104952;
        uVar4 = (ulong)uVar10;
        goto LAB_00104935;
      }
      uVar9 = (uVar7 - 1) + uVar10;
      uVar6 = uVar9 >> 1;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar9 & 0xfffffffe));
      if (uVar13 <= uVar1) break;
      uVar10 = uVar6 + 1;
      iVar5 = uVar6 + 0x11;
    }
    uVar7 = uVar6;
  } while (uVar13 < uVar1);
LAB_00104928:
  uVar8 = 1;
  goto LAB_00104954;
  while( true ) {
    if (uVar13 <= uVar1 && uVar1 != uVar13) goto LAB_00104952;
    uVar8 = 0;
    iVar5 = (int)uVar4;
    uVar4 = uVar4 + 1;
    if (uVar7 - 1 == iVar5) break;
LAB_00104935:
    uVar1 = container->array[uVar4];
    if (uVar1 == uVar13) goto LAB_00104928;
  }
LAB_00104954:
  _assert_true(uVar8,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x4f);
  iVar5 = container->cardinality;
  if (0 < iVar5) {
    puVar2 = container->array;
    iVar12 = iVar5 + -1;
    iVar11 = 0;
    do {
      uVar10 = (uint)(iVar12 + iVar11) >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar12 + iVar11 & 0xfffffffe));
      if (uVar1 < uVar13) {
        iVar11 = uVar10 + 1;
      }
      else {
        if (uVar1 <= uVar13) {
          memmove(puVar2 + uVar10,puVar2 + (ulong)uVar10 + 1,(long)(int)(iVar5 + ~uVar10) * 2);
          container->cardinality = container->cardinality + -1;
          uVar8 = 1;
          goto LAB_001049c1;
        }
        iVar12 = uVar10 - 1;
      }
    } while (iVar11 <= iVar12);
  }
  uVar8 = 0;
LAB_001049c1:
  _assert_true(uVar8,"array_container_remove(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x50);
  uVar14 = uVar14 - 1;
  _assert_int_equal((long)container->cardinality,uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                    ,0x51);
  uVar10 = 0;
  uVar7 = container->cardinality;
  do {
    iVar5 = uVar10 + 0x10;
    while( true ) {
      if ((int)uVar7 <= iVar5) {
        uVar8 = 1;
        if ((int)uVar7 <= (int)uVar10) goto LAB_00104a42;
        uVar4 = (ulong)uVar10;
        goto LAB_00104a2c;
      }
      uVar9 = (uVar7 - 1) + uVar10;
      uVar6 = uVar9 >> 1;
      uVar1 = *(ushort *)((long)container->array + (ulong)(uVar9 & 0xfffffffe));
      if (uVar13 <= uVar1) break;
      uVar10 = uVar6 + 1;
      iVar5 = uVar6 + 0x11;
    }
    uVar7 = uVar6;
  } while (uVar13 < uVar1);
LAB_00104a1d:
  uVar8 = 0;
LAB_00104a42:
  _assert_true(uVar8,"array_container_contains(B, x)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x52);
  bVar16 = 0xfffc < uVar3;
  uVar3 = uVar3 + 3;
  if (bVar16) {
    array_container_free(container);
    return;
  }
  goto LAB_001048f2;
LAB_00104952:
  uVar8 = 0;
  goto LAB_00104954;
  while ((uVar1 <= uVar13 && (iVar5 = (int)uVar4, uVar4 = uVar4 + 1, uVar7 - 1 != iVar5))) {
LAB_00104a2c:
    uVar1 = container->array[uVar4];
    if (uVar1 == uVar13) goto LAB_00104a1d;
  }
  goto LAB_00104a42;
}

Assistant:

DEFINE_TEST(add_contains_test) {
    array_container_t* B = array_container_create();
    assert_non_null(B);

    int expected_card = 0;

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_add(B, x));
        assert_true(array_container_contains(B, x));
        assert_int_equal(B->cardinality, ++expected_card);
        assert_false(B->cardinality > B->capacity);
    }

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(array_container_contains(B, x), (x / 3 * 3 == x));
    }

    assert_int_equal(array_container_cardinality(B), (1 << 16) / 3 + 1);

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_contains(B, x));
        assert_true(array_container_remove(B, x));
        assert_int_equal(B->cardinality, --expected_card);
        assert_false(array_container_contains(B, x));
    }

    assert_int_equal(array_container_cardinality(B), 0);

    for (int x = 65535; x >= 0; x -= 3) {
        assert_true(array_container_add(B, x));
        assert_true(array_container_contains(B, x));
        assert_int_equal(B->cardinality, ++expected_card);
        assert_false(B->cardinality > B->capacity);
    }

    assert_int_equal(array_container_cardinality(B), expected_card);

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(array_container_contains(B, x), (x / 3 * 3 == x));
    }

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_contains(B, x));
        assert_true(array_container_remove(B, x));
        assert_int_equal(B->cardinality, --expected_card);
        assert_false(array_container_contains(B, x));
    }

    array_container_free(B);
}